

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

path * ghc::filesystem::current_path(path *__return_storage_ptr__,error_code *ec)

{
  int iVar1;
  long lVar2;
  int *piVar3;
  char *pcVar4;
  pointer __buf;
  error_code eVar5;
  pointer local_50;
  undefined4 local_44;
  int local_40;
  undefined4 uStack_3c;
  error_category *local_38;
  unique_ptr<char[],_std::default_delete<char[]>_> local_30;
  unique_ptr<char[],_std::default_delete<char[]>_> buffer;
  size_t pathlen;
  error_code *ec_local;
  
  std::error_code::clear(ec);
  lVar2 = pathconf(".",4);
  buffer._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
  super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.super__Head_base<0UL,_char_*,_false>.
  _M_head_impl._4_4_ = (undefined4)lVar2;
  buffer._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
  super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.super__Head_base<0UL,_char_*,_false>.
  _M_head_impl._0_4_ = 0x1000;
  piVar3 = std::max<int>((int *)((long)&buffer._M_t.
                                        super___uniq_ptr_impl<char,_std::default_delete<char[]>_>.
                                        _M_t.
                                        super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>
                                        .super__Head_base<0UL,_char_*,_false>._M_head_impl + 4),
                         (int *)&buffer);
  iVar1 = *piVar3;
  pcVar4 = (char *)operator_new__((long)iVar1 + 1);
  std::unique_ptr<char[],std::default_delete<char[]>>::
  unique_ptr<char*,std::default_delete<char[]>,void,bool>
            ((unique_ptr<char[],std::default_delete<char[]>> *)&local_30,pcVar4);
  __buf = std::unique_ptr<char[],_std::default_delete<char[]>_>::get(&local_30);
  pcVar4 = getcwd(__buf,(long)iVar1);
  if (pcVar4 == (char *)0x0) {
    eVar5 = detail::make_system_error(0);
    local_38 = eVar5._M_cat;
    local_40 = eVar5._M_value;
    *(ulong *)ec = CONCAT44(uStack_3c,local_40);
    ec->_M_cat = local_38;
    path::path(__return_storage_ptr__);
  }
  else {
    local_50 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get(&local_30);
    path::path<char*,ghc::filesystem::path>(__return_storage_ptr__,&local_50,auto_format);
  }
  local_44 = 1;
  std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr(&local_30);
  return __return_storage_ptr__;
}

Assistant:

GHC_INLINE path current_path(std::error_code& ec)
{
    ec.clear();
#ifdef GHC_OS_WINDOWS
    DWORD pathlen = ::GetCurrentDirectoryW(0, 0);
    std::unique_ptr<wchar_t[]> buffer(new wchar_t[size_t(pathlen) + 1]);
    if (::GetCurrentDirectoryW(pathlen, buffer.get()) == 0) {
        ec = detail::make_system_error();
        return path();
    }
    return path(std::wstring(buffer.get()), path::native_format);
#else
    size_t pathlen = static_cast<size_t>(std::max(int(::pathconf(".", _PC_PATH_MAX)), int(PATH_MAX)));
    std::unique_ptr<char[]> buffer(new char[pathlen + 1]);
    if (::getcwd(buffer.get(), pathlen) == nullptr) {
        ec = detail::make_system_error();
        return path();
    }
    return path(buffer.get());
#endif
}